

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregationValidator.h
# Opt level: O3

void __thiscall
jaegertracing::thrift::AggregationValidatorProcessor::~AggregationValidatorProcessor
          (AggregationValidatorProcessor *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_TDispatchProcessor).super_TProcessor._vptr_TProcessor =
       (_func_int **)&PTR__AggregationValidatorProcessor_00266a00;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::thrift::AggregationValidatorProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::thrift::AggregationValidatorProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::thrift::AggregationValidatorProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*)>_>_>
  ::~_Rb_tree(&(this->processMap_)._M_t);
  p_Var1 = (this->iface_).
           super___shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  (this->super_TDispatchProcessor).super_TProcessor._vptr_TProcessor =
       (_func_int **)&PTR__TProcessor_00266860;
  p_Var1 = (this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
           super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

virtual ~AggregationValidatorProcessor() {}